

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void phosg::print_log_prefix(FILE *stream,LogLevel level)

{
  char cVar1;
  uint uVar2;
  time_t now_secs;
  char time_buffer [32];
  tm now_tm;
  time_t local_80;
  char local_78 [40];
  tm local_50;
  
  local_80 = time((time_t *)0x0);
  localtime_r(&local_80,&local_50);
  strftime(local_78,0x20,"%Y-%m-%d %H:%M:%S",&local_50);
  if ((ulong)(long)level < (ulong)(_DAT_00124438 - log_level_chars)) {
    cVar1 = *(char *)(log_level_chars + level);
    uVar2 = getpid_cached();
    fprintf((FILE *)stream,"%c %d %s - ",(ulong)(uint)(int)cVar1,(ulong)uVar2,local_78);
    return;
  }
  ::std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void print_log_prefix(FILE* stream, LogLevel level) {
  char time_buffer[32];
  time_t now_secs = time(nullptr);
  struct tm now_tm;
  localtime_r(&now_secs, &now_tm);
  strftime(time_buffer, sizeof(time_buffer), "%Y-%m-%d %H:%M:%S", &now_tm);
  char level_char = log_level_chars.at(static_cast<int>(level));
  fprintf(stream, "%c %d %s - ", level_char, getpid_cached(), time_buffer);
}